

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommonstyle.cpp
# Opt level: O1

QCommonStyle * __thiscall
QCommonStyle::standardPixmap
          (QCommonStyle *this,StandardPixmap sp,QStyleOption *option,QWidget *widget)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  StandardPixmap standardIcon;
  undefined4 in_register_00000034;
  long in_R8;
  long in_FS_OFFSET;
  double dVar4;
  QIcon icon_1;
  QIcon moved;
  QIcon icon;
  QImage local_88 [24];
  undefined1 local_70 [24];
  QIcon local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  QIcon local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(undefined8 *)(CONCAT44(in_register_00000034,sp) + 8);
  local_40.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon(&local_40);
  local_70._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QIcon::QIcon((QIcon *)local_70);
  local_58.d = local_40.d;
  local_40.d = (QIconPrivate *)local_70._0_8_;
  local_70._0_8_ = (QIconPrivate *)0x0;
  QIcon::~QIcon(&local_58);
  QIcon::~QIcon((QIcon *)local_70);
  cVar2 = QIcon::isNull();
  if (cVar2 != '\0') {
    standardIcon = (StandardPixmap)uVar1;
    QCommonStylePrivate::iconFromApplicationTheme
              ((QCommonStylePrivate *)local_70,standardIcon,
               (QStyleOption *)((ulong)option & 0xffffffff),widget);
    local_58.d = local_40.d;
    local_40.d = (QIconPrivate *)local_70._0_8_;
    local_70._0_8_ = (QIconPrivate *)0x0;
    QIcon::~QIcon(&local_58);
    QIcon::~QIcon((QIcon *)local_70);
    cVar2 = QIcon::isNull();
    if (cVar2 != '\0') {
      QIcon::QIcon((QIcon *)local_70);
      local_58.d = local_40.d;
      local_40.d = (QIconPrivate *)local_70._0_8_;
      local_70._0_8_ = (QIconPrivate *)0x0;
      QIcon::~QIcon(&local_58);
      QIcon::~QIcon((QIcon *)local_70);
      cVar2 = QIcon::isNull();
      if (cVar2 != '\0') {
        QCommonStylePrivate::iconFromResourceTheme
                  ((QCommonStylePrivate *)local_70,standardIcon,
                   (QStyleOption *)((ulong)option & 0xffffffff),widget);
        local_58.d = local_40.d;
        local_40.d = (QIconPrivate *)local_70._0_8_;
        local_70._0_8_ = (QIconPrivate *)0x0;
        QIcon::~QIcon(&local_58);
        QIcon::~QIcon((QIcon *)local_70);
        cVar2 = QIcon::isNull();
        if (cVar2 != '\0') {
          switch((QStyleOption *)((ulong)option & 0xffffffff)) {
          case (QStyleOption *)0x0:
            break;
          case (QStyleOption *)0x1:
            break;
          case (QStyleOption *)0x2:
            break;
          case (QStyleOption *)0x3:
            break;
          case (QStyleOption *)0x4:
            break;
          case (QStyleOption *)0x5:
            break;
          case (QStyleOption *)0x6:
            break;
          case (QStyleOption *)0x7:
            break;
          case (QStyleOption *)0x8:
            break;
          case (QStyleOption *)0x9:
            break;
          case (QStyleOption *)0xa:
            break;
          case (QStyleOption *)0xb:
            break;
          case (QStyleOption *)0xc:
            break;
          default:
            QPixmap::QPixmap((QPixmap *)this);
            goto LAB_0033a4a4;
          case (QStyleOption *)0x1b:
            if (widget == (QWidget *)0x0) {
              iVar3 = QGuiApplication::layoutDirection();
            }
            else {
              iVar3 = *(int *)&widget->field_0xc;
            }
            if (iVar3 == 1) {
              local_48 = &DAT_aaaaaaaaaaaaaaaa;
              local_58.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
              puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
              QImage::QImage(local_88,tb_extension_arrow_h_xpm);
              QImage::convertToFormat((QImage *)local_70,(Format)local_88,(ImageConversionFlags)0x5)
              ;
              QImage::flipped((QImage *)&local_58,
                              (QFlagsStorageHelper<Qt::Orientation,_4>)SUB84((QImage *)local_70,0));
              QImage::~QImage((QImage *)local_70);
              QImage::~QImage(local_88);
              QPixmap::fromImageInPlace(this,(QImage *)&local_58,0);
              QImage::~QImage((QImage *)&local_58);
              goto LAB_0033a4a4;
            }
            break;
          case (QStyleOption *)0x1c:
            break;
          case (QStyleOption *)0x1d:
            break;
          case (QStyleOption *)0x1e:
          }
          cachedPixmapFromXPM((char **)this);
          goto LAB_0033a4a4;
        }
      }
    }
  }
  local_58.d = (QIconPrivate *)0x1000000010;
  if (in_R8 == 0) {
    dVar4 = (double)QGuiApplication::devicePixelRatio();
  }
  else {
    dVar4 = (double)QPaintDevice::devicePixelRatio();
  }
  QIcon::pixmap((QSize *)this,dVar4,(Mode)&local_40,(State)&local_58);
LAB_0033a4a4:
  QIcon::~QIcon(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap QCommonStyle::standardPixmap(StandardPixmap sp, const QStyleOption *option,
                                     const QWidget *widget) const
{
    Q_D(const QCommonStyle);
    QIcon icon;

    icon = d->iconFromWindowsTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromApplicationTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromMacTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

    icon = d->iconFromResourceTheme(sp, option, widget);
    if (!icon.isNull())
        return icon.pixmap(QSize(16, 16), QStyleHelper::getDpr(widget));

#ifndef QT_NO_IMAGEFORMAT_XPM
    switch (sp) {
    case QStyle::SP_ToolBarHorizontalExtensionButton:
        if (d->rtl(option)) {
            auto im = QImage(tb_extension_arrow_h_xpm).convertToFormat(QImage::Format_ARGB32).flipped(Qt::Horizontal);
            return QPixmap::fromImage(std::move(im));
        }
        return cachedPixmapFromXPM(tb_extension_arrow_h_xpm);
    case QStyle::SP_ToolBarVerticalExtensionButton:
        return cachedPixmapFromXPM(tb_extension_arrow_v_xpm);
    case QStyle::SP_FileDialogStart:
        return cachedPixmapFromXPM(filedialog_start_xpm);
    case QStyle::SP_FileDialogEnd:
        return cachedPixmapFromXPM(filedialog_end_xpm);
    case QStyle::SP_TitleBarMenuButton:
        return titleBarMenuCachedPixmapFromXPM();
    case QStyle::SP_TitleBarShadeButton:
        return cachedPixmapFromXPM(qt_shade_xpm);
    case QStyle::SP_TitleBarUnshadeButton:
        return cachedPixmapFromXPM(qt_unshade_xpm);
    case QStyle::SP_TitleBarNormalButton:
        return cachedPixmapFromXPM(qt_normalizeup_xpm);
    case QStyle::SP_TitleBarMinButton:
        return cachedPixmapFromXPM(qt_minimize_xpm);
    case QStyle::SP_TitleBarMaxButton:
        return cachedPixmapFromXPM(qt_maximize_xpm);
    case QStyle::SP_TitleBarCloseButton:
        return cachedPixmapFromXPM(qt_close_xpm);
    case QStyle::SP_TitleBarContextHelpButton:
        return cachedPixmapFromXPM(qt_help_xpm);
    case QStyle::SP_DockWidgetCloseButton:
        return cachedPixmapFromXPM(dock_widget_close_xpm);
    case QStyle::SP_MessageBoxInformation:
        return cachedPixmapFromXPM(information_xpm);
    case QStyle::SP_MessageBoxWarning:
        return cachedPixmapFromXPM(warning_xpm);
    case QStyle::SP_MessageBoxCritical:
        return cachedPixmapFromXPM(critical_xpm);
    case QStyle::SP_MessageBoxQuestion:
        return cachedPixmapFromXPM(question_xpm);
    default:
        break;
    }
#endif //QT_NO_IMAGEFORMAT_XPM

    return QPixmap();
}